

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

char * xm_load_module(xm_context_t *ctx,char *moddata,size_t moddata_length,char *mempool)

{
  xm_instrument_t *pxVar1;
  xm_sample_t *pxVar2;
  size_t __n;
  byte bVar3;
  byte bVar4;
  uint16_t k;
  ushort uVar5;
  xm_waveform_type_t xVar6;
  xm_frequency_type_t xVar7;
  int iVar8;
  uint8_t *puVar9;
  byte bVar10;
  byte bVar11;
  ushort uVar12;
  char cVar13;
  ulong uVar14;
  xm_instrument_t *pxVar15;
  byte bVar16;
  uint8_t uVar17;
  byte bVar18;
  uint uVar19;
  uint uVar20;
  byte bVar21;
  ushort uVar22;
  ushort uVar23;
  xm_pattern_t *pxVar24;
  ulong uVar25;
  ushort uVar26;
  short sVar27;
  byte bVar28;
  char cVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  uint8_t *src_c;
  ulong uVar37;
  float fVar38;
  xm_instrument_t *local_80;
  ulong local_68;
  long local_60;
  long local_58;
  
  if (moddata_length < 0x3d) {
    uVar37 = 0;
  }
  else {
    uVar37 = (ulong)(byte)moddata[0x3c];
  }
  if (moddata_length < 0x3e) {
    uVar14 = 0;
  }
  else {
    uVar14 = (ulong)(byte)moddata[0x3d] << 8;
  }
  if (moddata_length < 0x3f) {
    uVar20 = 0;
  }
  else {
    uVar20 = (uint)(byte)moddata[0x3e];
  }
  if (moddata_length < 0x40) {
    uVar30 = 0;
  }
  else {
    uVar30 = (uint)(byte)moddata[0x3f] << 8;
  }
  if (moddata_length < 0x41) {
    uVar22 = 0;
  }
  else {
    uVar22 = (ushort)(byte)moddata[0x40];
  }
  if (moddata_length < 0x42) {
    uVar26 = 0;
  }
  else {
    uVar26 = (ushort)(byte)moddata[0x41] << 8;
  }
  (ctx->module).length = uVar22 | uVar26;
  if (moddata_length < 0x43) {
    uVar22 = 0;
  }
  else {
    uVar22 = (ushort)(byte)moddata[0x42];
  }
  if (moddata_length < 0x44) {
    uVar26 = 0;
  }
  else {
    uVar26 = (ushort)(byte)moddata[0x43] << 8;
  }
  (ctx->module).restart_position = uVar22 | uVar26;
  if (moddata_length < 0x45) {
    uVar22 = 0;
  }
  else {
    uVar22 = (ushort)(byte)moddata[0x44];
  }
  if (moddata_length < 0x46) {
    uVar26 = 0;
  }
  else {
    uVar26 = (ushort)(byte)moddata[0x45] << 8;
  }
  (ctx->module).num_channels = uVar22 | uVar26;
  if (moddata_length < 0x47) {
    uVar33 = 0;
  }
  else {
    uVar33 = (uint)(byte)moddata[0x46];
  }
  if (moddata_length < 0x48) {
    uVar22 = 0;
  }
  else {
    uVar22 = (ushort)(byte)moddata[0x47] << 8;
  }
  (ctx->module).num_patterns = (ushort)uVar33 | uVar22;
  if (moddata_length < 0x49) {
    uVar19 = 0;
  }
  else {
    uVar19 = (uint)(byte)moddata[0x48];
  }
  if (moddata_length < 0x4a) {
    uVar34 = 0;
  }
  else {
    uVar34 = (uint)(byte)moddata[0x49] << 8;
  }
  (ctx->module).num_instruments = (ushort)uVar19 | (ushort)uVar34;
  (ctx->module).patterns = (xm_pattern_t *)mempool;
  (ctx->module).instruments = (xm_instrument_t *)(mempool + ((uVar33 | uVar22) << 4));
  xVar7 = XM_AMIGA_FREQUENCIES;
  if (0x4a < moddata_length) {
    xVar7 = ~(uint)(byte)moddata[0x4a] & XM_AMIGA_FREQUENCIES;
  }
  (ctx->module).frequency_type = xVar7;
  if (moddata_length < 0x4d) {
    uVar26 = 0;
  }
  else {
    uVar26 = (ushort)(byte)moddata[0x4c];
  }
  if (moddata_length < 0x4e) {
    uVar12 = 0;
  }
  else {
    uVar12 = (ushort)(byte)moddata[0x4d] << 8;
  }
  ctx->tempo = uVar26 | uVar12;
  if (moddata_length < 0x4f) {
    uVar26 = 0;
  }
  else {
    uVar26 = (ushort)(byte)moddata[0x4e];
  }
  if (moddata_length < 0x50) {
    uVar12 = 0;
  }
  else {
    uVar12 = (ushort)(byte)moddata[0x4f] << 8;
  }
  local_80 = (xm_instrument_t *)(mempool + ((uVar33 | uVar22) << 4)) + (uVar19 | uVar34);
  ctx->bpm = uVar26 | uVar12;
  uVar36 = 0;
  if (0x4f < moddata_length) {
    uVar36 = moddata_length - 0x50;
  }
  if (0xff < uVar36) {
    uVar36 = 0x100;
  }
  memcpy((ctx->module).pattern_table,moddata + 0x50,uVar36);
  memset((ctx->module).pattern_table + uVar36,0,0x100 - uVar36);
  uVar37 = (uVar14 | uVar37 | (ulong)((uVar30 | uVar20) << 0x10)) + 0x3c;
  if ((ctx->module).num_patterns != 0) {
    uVar14 = 0;
    do {
      if (uVar37 + 7 < moddata_length) {
        uVar22 = (ushort)(byte)moddata[uVar37 + 7];
      }
      else {
        uVar22 = 0;
      }
      if (uVar37 + 8 < moddata_length) {
        uVar26 = (ushort)(byte)moddata[uVar37 + 8] << 8;
      }
      else {
        uVar26 = 0;
      }
      if (uVar37 + 5 < moddata_length) {
        uVar12 = (ushort)(byte)moddata[uVar37 + 5];
      }
      else {
        uVar12 = 0;
      }
      if (uVar37 + 6 < moddata_length) {
        uVar5 = (ushort)(byte)moddata[uVar37 + 6] << 8;
      }
      else {
        uVar5 = 0;
      }
      pxVar24 = (ctx->module).patterns + uVar14;
      pxVar24->num_rows = uVar12 | uVar5;
      pxVar24->slots = (xm_pattern_slot_t *)local_80;
      if (uVar37 < moddata_length) {
        uVar36 = (ulong)(byte)moddata[uVar37];
      }
      else {
        uVar36 = 0;
      }
      if (uVar37 + 1 < moddata_length) {
        uVar25 = (ulong)(byte)moddata[uVar37 + 1] << 8;
      }
      else {
        uVar25 = 0;
      }
      if (uVar37 + 2 < moddata_length) {
        uVar20 = (uint)(byte)moddata[uVar37 + 2];
      }
      else {
        uVar20 = 0;
      }
      if (uVar37 + 3 < moddata_length) {
        uVar30 = (uint)(byte)moddata[uVar37 + 3] << 8;
      }
      else {
        uVar30 = 0;
      }
      __n = (ulong)(uVar12 | uVar5) * (ulong)(ctx->module).num_channels * 5;
      lVar35 = ((ulong)((uVar30 | uVar20) << 0x10) | uVar25 | uVar36) + uVar37;
      if ((uVar22 | uVar26) == 0) {
        memset(local_80,0,__n);
      }
      else {
        uVar12 = 0;
        uVar5 = 0;
        do {
          uVar37 = (ulong)uVar12 + lVar35;
          if (uVar37 < moddata_length) {
            bVar10 = moddata[uVar37];
          }
          else {
            bVar10 = 0;
          }
          puVar9 = local_80->sample_of_notes + (ulong)uVar5 * 5 + -2;
          if ((char)bVar10 < '\0') {
            uVar23 = uVar12 + 1;
            if ((bVar10 & 1) == 0) {
              *puVar9 = 0;
            }
            else {
              if ((ulong)uVar23 + lVar35 < moddata_length) {
                bVar16 = moddata[(ulong)uVar23 + lVar35];
              }
              else {
                bVar16 = 0;
              }
              *puVar9 = bVar16;
              uVar23 = uVar12 + 2;
            }
            if ((bVar10 & 2) == 0) {
              puVar9[1] = 0;
            }
            else {
              if ((ulong)uVar23 + lVar35 < moddata_length) {
                bVar16 = moddata[(ulong)uVar23 + lVar35];
              }
              else {
                bVar16 = 0;
              }
              puVar9[1] = bVar16;
              uVar23 = uVar23 + 1;
            }
            if ((bVar10 & 4) == 0) {
              puVar9[2] = 0;
            }
            else {
              if ((ulong)uVar23 + lVar35 < moddata_length) {
                bVar16 = moddata[(ulong)uVar23 + lVar35];
              }
              else {
                bVar16 = 0;
              }
              puVar9[2] = bVar16;
              uVar23 = uVar23 + 1;
            }
            if ((bVar10 & 8) == 0) {
              puVar9[3] = 0;
              uVar12 = uVar23;
            }
            else {
              if ((ulong)uVar23 + lVar35 < moddata_length) {
                bVar16 = moddata[(ulong)uVar23 + lVar35];
              }
              else {
                bVar16 = 0;
              }
              puVar9[3] = bVar16;
              uVar12 = uVar23 + 1;
            }
            if ((bVar10 & 0x10) == 0) {
              puVar9[4] = 0;
            }
            else {
              if ((ulong)uVar12 + lVar35 < moddata_length) {
                bVar10 = moddata[(ulong)uVar12 + lVar35];
              }
              else {
                bVar10 = 0;
              }
              puVar9[4] = bVar10;
              uVar12 = uVar12 + 1;
            }
          }
          else {
            *puVar9 = bVar10;
            if (uVar37 + 1 < moddata_length) {
              bVar10 = moddata[uVar37 + 1];
            }
            else {
              bVar10 = 0;
            }
            puVar9[1] = bVar10;
            if (uVar37 + 2 < moddata_length) {
              bVar10 = moddata[uVar37 + 2];
            }
            else {
              bVar10 = 0;
            }
            puVar9[2] = bVar10;
            if (uVar37 + 3 < moddata_length) {
              bVar10 = moddata[uVar37 + 3];
            }
            else {
              bVar10 = 0;
            }
            puVar9[3] = bVar10;
            if (uVar37 + 4 < moddata_length) {
              bVar10 = moddata[uVar37 + 4];
            }
            else {
              bVar10 = 0;
            }
            puVar9[4] = bVar10;
            uVar12 = uVar12 + 5;
          }
          uVar5 = uVar5 + 1;
        } while (uVar12 < (uVar22 | uVar26));
      }
      local_80 = (xm_instrument_t *)(local_80->sample_of_notes + (__n - 2));
      uVar37 = lVar35 + (ulong)(uVar22 | uVar26);
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ctx->module).num_patterns);
  }
  if ((ctx->module).num_instruments != 0) {
    local_58 = 100;
    local_60 = 0x9c;
    local_68 = 0;
    do {
      uVar20 = 0;
      if (uVar37 < moddata_length) {
        uVar20 = (uint)(byte)moddata[uVar37];
      }
      uVar33 = 0;
      uVar30 = 0;
      if (uVar37 + 1 < moddata_length) {
        uVar30 = (uint)(byte)moddata[uVar37 + 1] << 8;
      }
      if (uVar37 + 2 < moddata_length) {
        uVar33 = (uint)(byte)moddata[uVar37 + 2];
      }
      uVar19 = 0;
      if (uVar37 + 3 < moddata_length) {
        uVar19 = (uint)(byte)moddata[uVar37 + 3] << 8;
      }
      uVar19 = (uVar19 | uVar33) * 0x10000;
      uVar33 = uVar30 | uVar20 | uVar19;
      if (((uVar30 | uVar20) + uVar19) - 0x108 < 0xfffffef9) {
        uVar33 = 0x107;
      }
      uVar14 = uVar33 + uVar37;
      if (uVar37 + 0x1b < uVar14) {
        uVar22 = (ushort)(byte)moddata[uVar37 + 0x1b];
      }
      else {
        uVar22 = 0;
      }
      if (uVar37 + 0x1c < uVar14) {
        uVar26 = (ushort)(byte)moddata[uVar37 + 0x1c] << 8;
      }
      else {
        uVar26 = 0;
      }
      pxVar1 = (ctx->module).instruments;
      pxVar15 = pxVar1 + local_68;
      pxVar15->num_samples = uVar26 | uVar22;
      if ((uVar26 | uVar22) == 0) {
        pxVar15->samples = (xm_sample_t *)0x0;
      }
      else {
        uVar36 = 0;
        if (uVar37 + 0x21 <= uVar14) {
          uVar36 = uVar14 - (uVar37 + 0x21);
        }
        if (0x5f < uVar36) {
          uVar36 = 0x60;
        }
        memcpy(pxVar15->sample_of_notes,moddata + uVar37 + 0x21,uVar36);
        memset(pxVar15->sample_of_notes + uVar36,0,0x60 - uVar36);
        bVar10 = 0;
        if (uVar37 + 0xe1 < uVar14) {
          bVar10 = moddata[uVar37 + 0xe1];
        }
        bVar16 = bVar10;
        if (0xb < bVar10) {
          bVar16 = 0xc;
        }
        (pxVar15->volume_envelope).num_points = bVar16;
        if (uVar37 + 0xe2 < uVar14) {
          bVar3 = moddata[uVar37 + 0xe2];
        }
        else {
          bVar3 = 0;
        }
        bVar11 = bVar3;
        if (0xb < bVar3) {
          bVar11 = 0xc;
        }
        (pxVar15->panning_envelope).num_points = bVar11;
        if (bVar10 != 0) {
          uVar36 = 0;
          do {
            if (uVar37 + uVar36 + 0x81 < uVar14) {
              uVar22 = (ushort)(byte)moddata[uVar36 + uVar37 + 0x81];
            }
            else {
              uVar22 = 0;
            }
            if (uVar37 + uVar36 + 0x82 < uVar14) {
              uVar26 = (ushort)(byte)moddata[uVar36 + uVar37 + 0x82] << 8;
            }
            else {
              uVar26 = 0;
            }
            *(ushort *)(pxVar1->sample_of_notes + uVar36 + local_58 + -4) = uVar22 | uVar26;
            if (uVar37 + uVar36 + 0x83 < uVar14) {
              uVar22 = (ushort)(byte)moddata[uVar36 + uVar37 + 0x83];
            }
            else {
              uVar22 = 0;
            }
            if (uVar37 + uVar36 + 0x84 < uVar14) {
              uVar26 = (ushort)(byte)moddata[uVar36 + uVar37 + 0x84] << 8;
            }
            else {
              uVar26 = 0;
            }
            *(ushort *)(pxVar1->sample_of_notes + uVar36 + local_58 + -2) = uVar22 | uVar26;
            uVar36 = uVar36 + 4;
          } while ((uint)bVar16 * 4 != uVar36);
        }
        if (bVar3 != 0) {
          uVar36 = 0;
          do {
            if (uVar37 + uVar36 + 0xb1 < uVar14) {
              uVar22 = (ushort)(byte)moddata[uVar36 + uVar37 + 0xb1];
            }
            else {
              uVar22 = 0;
            }
            if (uVar37 + uVar36 + 0xb2 < uVar14) {
              uVar26 = (ushort)(byte)moddata[uVar36 + uVar37 + 0xb2] << 8;
            }
            else {
              uVar26 = 0;
            }
            *(ushort *)(pxVar1->sample_of_notes + uVar36 + local_60 + -4) = uVar22 | uVar26;
            if (uVar37 + uVar36 + 0xb3 < uVar14) {
              uVar22 = (ushort)(byte)moddata[uVar36 + uVar37 + 0xb3];
            }
            else {
              uVar22 = 0;
            }
            if (uVar37 + uVar36 + 0xb4 < uVar14) {
              uVar26 = (ushort)(byte)moddata[uVar36 + uVar37 + 0xb4] << 8;
            }
            else {
              uVar26 = 0;
            }
            *(ushort *)(pxVar1->sample_of_notes + uVar36 + local_60 + -2) = uVar22 | uVar26;
            uVar36 = uVar36 + 4;
          } while ((uint)bVar11 * 4 != uVar36);
        }
        if (uVar37 + 0xe3 < uVar14) {
          uVar17 = moddata[uVar37 + 0xe3];
        }
        else {
          uVar17 = '\0';
        }
        (pxVar15->volume_envelope).sustain_point = uVar17;
        if (uVar37 + 0xe4 < uVar14) {
          bVar18 = moddata[uVar37 + 0xe4];
        }
        else {
          bVar18 = 0;
        }
        (pxVar15->volume_envelope).loop_start_point = bVar18;
        if (uVar37 + 0xe5 < uVar14) {
          bVar21 = moddata[uVar37 + 0xe5];
        }
        else {
          bVar21 = 0;
        }
        (pxVar15->volume_envelope).loop_end_point = bVar21;
        if (uVar37 + 0xe6 < uVar14) {
          uVar17 = moddata[uVar37 + 0xe6];
        }
        else {
          uVar17 = '\0';
        }
        (pxVar15->panning_envelope).sustain_point = uVar17;
        if (uVar37 + 0xe7 < uVar14) {
          bVar4 = moddata[uVar37 + 0xe7];
        }
        else {
          bVar4 = 0;
        }
        (pxVar15->panning_envelope).loop_start_point = bVar4;
        if (uVar37 + 0xe8 < uVar14) {
          bVar28 = moddata[uVar37 + 0xe8];
        }
        else {
          bVar28 = 0;
        }
        (pxVar15->panning_envelope).loop_end_point = bVar28;
        if (bVar10 != 0) {
          iVar8 = bVar16 - 1;
          if (iVar8 <= (int)(uint)bVar18) {
            bVar18 = (byte)iVar8;
          }
          (pxVar15->volume_envelope).loop_start_point = bVar18;
          bVar10 = (byte)iVar8;
          if ((int)(uint)bVar21 < iVar8) {
            bVar10 = bVar21;
          }
          (pxVar15->volume_envelope).loop_end_point = bVar10;
        }
        if (bVar3 != 0) {
          iVar8 = bVar11 - 1;
          if (iVar8 <= (int)(uint)bVar4) {
            bVar4 = (byte)iVar8;
          }
          (pxVar15->panning_envelope).loop_start_point = bVar4;
          bVar10 = (byte)iVar8;
          if ((int)(uint)bVar28 < iVar8) {
            bVar10 = bVar28;
          }
          (pxVar15->panning_envelope).loop_end_point = bVar10;
        }
        if (uVar37 + 0xe9 < uVar14) {
          uVar36 = (ulong)(byte)moddata[uVar37 + 0xe9];
        }
        else {
          uVar36 = 0;
        }
        (pxVar15->volume_envelope).enabled = (_Bool)((byte)uVar36 & 1);
        (pxVar15->volume_envelope).sustain_enabled = (_Bool)((byte)(uVar36 >> 1) & 1);
        (pxVar15->volume_envelope).loop_enabled = (_Bool)((byte)uVar36 >> 2 & 1);
        xVar6 = XM_SINE_WAVEFORM;
        bVar10 = 0;
        if (uVar37 + 0xea < uVar14) {
          bVar10 = moddata[uVar37 + 0xea];
        }
        (pxVar15->panning_envelope).enabled = (_Bool)(bVar10 & 1);
        (pxVar15->panning_envelope).sustain_enabled = (_Bool)(bVar10 >> 1 & 1);
        (pxVar15->panning_envelope).loop_enabled = (_Bool)(bVar10 >> 2 & 1);
        if (uVar37 + 0xeb < uVar14) {
          xVar6 = (xm_waveform_type_t)(byte)moddata[uVar37 + 0xeb];
        }
        pxVar15->vibrato_type = xVar6;
        if (xVar6 == XM_SQUARE_WAVEFORM) {
          xVar6 = XM_RAMP_DOWN_WAVEFORM;
LAB_00103f99:
          pxVar15->vibrato_type = xVar6;
        }
        else if (xVar6 == XM_RAMP_DOWN_WAVEFORM) {
          xVar6 = XM_SQUARE_WAVEFORM;
          goto LAB_00103f99;
        }
        if (uVar37 + 0xec < uVar14) {
          uVar17 = moddata[uVar37 + 0xec];
        }
        else {
          uVar17 = '\0';
        }
        pxVar15->vibrato_sweep = uVar17;
        if (uVar37 + 0xed < uVar14) {
          uVar17 = moddata[uVar37 + 0xed];
        }
        else {
          uVar17 = '\0';
        }
        pxVar15->vibrato_depth = uVar17;
        if (uVar37 + 0xee < uVar14) {
          uVar17 = moddata[uVar37 + 0xee];
        }
        else {
          uVar17 = '\0';
        }
        pxVar15->vibrato_rate = uVar17;
        if (uVar37 + 0xef < uVar14) {
          uVar22 = (ushort)(byte)moddata[uVar37 + 0xef];
        }
        else {
          uVar22 = 0;
        }
        if (uVar37 + 0xf0 < uVar14) {
          uVar26 = (ushort)(byte)moddata[uVar37 + 0xf0] << 8;
        }
        else {
          uVar26 = 0;
        }
        pxVar15->volume_fadeout = uVar22 | uVar26;
        pxVar15->samples = (xm_sample_t *)local_80;
        local_80 = (xm_instrument_t *)
                   (local_80->sample_of_notes + (ulong)pxVar15->num_samples * 0x38 + -2);
      }
      if (pxVar15->num_samples != 0) {
        lVar35 = 0;
        uVar37 = 0;
        do {
          uVar36 = uVar14;
          uVar20 = 0;
          uVar30 = 0;
          if (uVar36 < moddata_length) {
            uVar30 = (uint)(byte)moddata[uVar36];
          }
          if (uVar36 + 1 < moddata_length) {
            uVar20 = (uint)(byte)moddata[uVar36 + 1] << 8;
          }
          uVar33 = 0;
          uVar19 = 0;
          if (uVar36 + 2 < moddata_length) {
            uVar19 = (uint)(byte)moddata[uVar36 + 2];
          }
          if (uVar36 + 3 < moddata_length) {
            uVar33 = (uint)(byte)moddata[uVar36 + 3] << 8;
          }
          pxVar2 = pxVar15->samples;
          uVar20 = (uVar33 | uVar19) << 0x10 | uVar20 | uVar30;
          *(uint *)((long)&pxVar2->length + lVar35) = uVar20;
          uVar30 = 0;
          uVar33 = 0;
          if (uVar36 + 4 < moddata_length) {
            uVar33 = (uint)(byte)moddata[uVar36 + 4];
          }
          if (uVar36 + 5 < moddata_length) {
            uVar30 = (uint)(byte)moddata[uVar36 + 5] << 8;
          }
          uVar19 = 0;
          uVar34 = 0;
          if (uVar36 + 6 < moddata_length) {
            uVar34 = (uint)(byte)moddata[uVar36 + 6];
          }
          if (uVar36 + 7 < moddata_length) {
            uVar19 = (uint)(byte)moddata[uVar36 + 7] << 8;
          }
          uVar30 = (uVar19 | uVar34) << 0x10 | uVar30 | uVar33;
          *(uint *)((long)&pxVar2->loop_start + lVar35) = uVar30;
          uVar33 = 0;
          uVar19 = 0;
          if (uVar36 + 8 < moddata_length) {
            uVar19 = (uint)(byte)moddata[uVar36 + 8];
          }
          if (uVar36 + 9 < moddata_length) {
            uVar33 = (uint)(byte)moddata[uVar36 + 9] << 8;
          }
          uVar31 = 0;
          uVar34 = 0;
          if (uVar36 + 10 < moddata_length) {
            uVar34 = (uint)(byte)moddata[uVar36 + 10];
          }
          if (uVar36 + 0xb < moddata_length) {
            uVar31 = (uint)(byte)moddata[uVar36 + 0xb] << 8;
          }
          uVar33 = (uVar31 | uVar34) << 0x10 | uVar33 | uVar19;
          *(uint *)((long)&pxVar2->loop_length + lVar35) = uVar33;
          uVar33 = uVar33 + uVar30;
          *(uint *)((long)&pxVar2->loop_end + lVar35) = uVar33;
          fVar38 = 0.0;
          if (uVar36 + 0xc < moddata_length) {
            fVar38 = (float)(byte)moddata[uVar36 + 0xc] * 0.015625;
          }
          *(float *)((long)&pxVar2->volume + lVar35) = fVar38;
          if (uVar36 + 0xd < moddata_length) {
            cVar13 = moddata[uVar36 + 0xd];
          }
          else {
            cVar13 = '\0';
          }
          (&pxVar2->finetune)[lVar35] = cVar13;
          if (uVar20 < uVar30) {
            *(uint *)((long)&pxVar2->loop_start + lVar35) = uVar20;
          }
          if (uVar20 < uVar33) {
            *(uint *)((long)&pxVar2->loop_end + lVar35) = uVar20;
          }
          uVar30 = *(uint *)((long)&pxVar2->loop_start + lVar35);
          uVar33 = *(uint *)((long)&pxVar2->loop_end + lVar35);
          *(uint *)((long)&pxVar2->loop_length + lVar35) = uVar33 - uVar30;
          uVar19 = 0;
          if (uVar36 + 0xe < moddata_length) {
            uVar19 = (uint)(byte)moddata[uVar36 + 0xe];
          }
          if (((uVar19 & 3) == 0) || (uVar33 == uVar30)) {
            *(undefined4 *)((long)&pxVar2->loop_type + lVar35) = 0;
          }
          else if ((uVar19 & 3) == 1) {
            *(undefined4 *)((long)&pxVar2->loop_type + lVar35) = 1;
          }
          else {
            *(undefined4 *)((long)&pxVar2->loop_type + lVar35) = 2;
          }
          (&pxVar2->bits)[lVar35] = (char)((uVar19 & 0x10) >> 4) * '\b' + '\b';
          fVar38 = 0.0;
          if (uVar36 + 0xf < moddata_length) {
            fVar38 = (float)(byte)moddata[uVar36 + 0xf];
          }
          *(float *)((long)&pxVar2->panning + lVar35) = fVar38 / 255.0;
          if (uVar36 + 0x10 < moddata_length) {
            cVar13 = moddata[uVar36 + 0x10];
          }
          else {
            cVar13 = '\0';
          }
          (&pxVar2->relative_note)[lVar35] = cVar13;
          *(xm_instrument_t **)((long)&pxVar2->field_11 + lVar35) = local_80;
          if ((uVar19 & 0x10) != 0) {
            *(uint *)((long)&pxVar2->loop_start + lVar35) = uVar30 >> 1;
            *(uint *)((long)&pxVar2->loop_length + lVar35) = uVar33 - uVar30 >> 1;
            *(uint *)((long)&pxVar2->loop_end + lVar35) = uVar33 >> 1;
            *(uint *)((long)&pxVar2->length + lVar35) = uVar20 >> 1;
          }
          local_80 = (xm_instrument_t *)(local_80->sample_of_notes + ((ulong)uVar20 - 2));
          uVar37 = uVar37 + 1;
          lVar35 = lVar35 + 0x38;
          uVar14 = uVar36 + 0x28;
        } while (uVar37 < pxVar15->num_samples);
        uVar14 = uVar36 + 0x28;
      }
      uVar37 = uVar14;
      if (pxVar15->num_samples != 0) {
        uVar14 = 0;
        do {
          pxVar2 = pxVar15->samples;
          uVar20 = pxVar2[uVar14].length;
          uVar36 = (ulong)uVar20;
          if (pxVar2[uVar14].bits == '\x10') {
            if (uVar36 != 0) {
              uVar25 = 0;
              sVar27 = 0;
              do {
                uVar32 = (uVar25 & 0xffffffff) + uVar37;
                uVar22 = 0;
                if (uVar32 < moddata_length) {
                  uVar22 = (ushort)(byte)moddata[uVar32];
                }
                uVar26 = 0;
                if (uVar32 + 1 < moddata_length) {
                  uVar26 = (ushort)(byte)moddata[uVar32 + 1] << 8;
                }
                sVar27 = sVar27 + (uVar26 | uVar22);
                *(short *)(pxVar2[uVar14].field_11.data8 + uVar25) = sVar27;
                uVar25 = uVar25 + 2;
              } while (uVar36 * 2 != uVar25);
            }
            uVar20 = uVar20 * 2;
          }
          else {
            if (uVar36 != 0) {
              uVar25 = 0;
              cVar13 = '\0';
              do {
                cVar29 = '\0';
                if (uVar37 + uVar25 < moddata_length) {
                  cVar29 = moddata[uVar25 + uVar37];
                }
                cVar13 = cVar13 + cVar29;
                pxVar2[uVar14].field_11.data8[uVar25] = cVar13;
                uVar25 = uVar25 + 1;
              } while (uVar36 != uVar25);
            }
            uVar20 = pxVar2[uVar14].length;
          }
          uVar37 = uVar37 + uVar20;
          uVar14 = uVar14 + 1;
        } while (uVar14 < pxVar15->num_samples);
      }
      local_68 = local_68 + 1;
      local_58 = local_58 + 0xf8;
      local_60 = local_60 + 0xf8;
    } while (local_68 < (ctx->module).num_instruments);
  }
  return (char *)local_80;
}

Assistant:

char* xm_load_module(xm_context_t* ctx, const char* moddata, size_t moddata_length, char* mempool) {
	size_t offset = 0;
	xm_module_t* mod = &(ctx->module);

	/* Read XM header */
#if XM_STRINGS
	READ_MEMCPY(mod->name, offset + 17, MODULE_NAME_LENGTH);
	READ_MEMCPY(mod->trackername, offset + 38, TRACKER_NAME_LENGTH);
#endif
	offset += 60;

	/* Read module header */
	uint32_t header_size = READ_U32(offset);

	mod->length = READ_U16(offset + 4);
	mod->restart_position = READ_U16(offset + 6);
	mod->num_channels = READ_U16(offset + 8);
	mod->num_patterns = READ_U16(offset + 10);
	mod->num_instruments = READ_U16(offset + 12);

	mod->patterns = (xm_pattern_t*)mempool;
	mempool += mod->num_patterns * sizeof(xm_pattern_t);

	mod->instruments = (xm_instrument_t*)mempool;
	mempool += mod->num_instruments * sizeof(xm_instrument_t);

	uint16_t flags = READ_U32(offset + 14);
	mod->frequency_type = (flags & (1 << 0)) ? XM_LINEAR_FREQUENCIES : XM_AMIGA_FREQUENCIES;

	ctx->tempo = READ_U16(offset + 16);
	ctx->bpm = READ_U16(offset + 18);

	READ_MEMCPY(mod->pattern_table, offset + 20, PATTERN_ORDER_TABLE_LENGTH);
	offset += header_size;

	/* Read patterns */
	for(uint16_t i = 0; i < mod->num_patterns; ++i) {
		uint16_t packed_patterndata_size = READ_U16(offset + 7);
		xm_pattern_t* pat = mod->patterns + i;

		pat->num_rows = READ_U16(offset + 5);

		pat->slots = (xm_pattern_slot_t*)mempool;
		mempool += mod->num_channels * pat->num_rows * sizeof(xm_pattern_slot_t);

		/* Pattern header length */
		offset += READ_U32(offset);

		if(packed_patterndata_size == 0) {
			/* No pattern data is present */
			memset(pat->slots, 0, sizeof(xm_pattern_slot_t) * pat->num_rows * mod->num_channels);
		} else {
			/* This isn't your typical for loop */
			for(uint16_t j = 0, k = 0; j < packed_patterndata_size; ++k) {
				uint8_t note = READ_U8(offset + j);
				xm_pattern_slot_t* slot = pat->slots + k;

				if(note & (1 << 7)) {
					/* MSB is set, this is a compressed packet */
					++j;

					if(note & (1 << 0)) {
						/* Note follows */
						slot->note = READ_U8(offset + j);
						++j;
					} else {
						slot->note = 0;
					}

					if(note & (1 << 1)) {
						/* Instrument follows */
						slot->instrument = READ_U8(offset + j);
						++j;
					} else {
						slot->instrument = 0;
					}

					if(note & (1 << 2)) {
						/* Volume column follows */
						slot->volume_column = READ_U8(offset + j);
						++j;
					} else {
						slot->volume_column = 0;
					}

					if(note & (1 << 3)) {
						/* Effect follows */
						slot->effect_type = READ_U8(offset + j);
						++j;
					} else {
						slot->effect_type = 0;
					}

					if(note & (1 << 4)) {
						/* Effect parameter follows */
						slot->effect_param = READ_U8(offset + j);
						++j;
					} else {
						slot->effect_param = 0;
					}
				} else {
					/* Uncompressed packet */
					slot->note = note;
					slot->instrument = READ_U8(offset + j + 1);
					slot->volume_column = READ_U8(offset + j + 2);
					slot->effect_type = READ_U8(offset + j + 3);
					slot->effect_param = READ_U8(offset + j + 4);
					j += 5;
				}
			}
		}

		offset += packed_patterndata_size;
	}

	/* Read instruments */
	for(uint16_t i = 0; i < ctx->module.num_instruments; ++i) {
		xm_instrument_t* instr = mod->instruments + i;

		/* Original FT2 would load instruments with a direct read into the
		   instrument data structure that was previously zeroed. This means
		   that if the declared length was less than INSTRUMENT_HEADER_LENGTH,
		   all excess data would be zeroed. This is used by the XM compressor
		   BoobieSqueezer. To implement this, bound all reads to the header size. */
		uint32_t ins_header_size = READ_U32(offset);
		if (ins_header_size == 0 || ins_header_size > INSTRUMENT_HEADER_LENGTH)
			ins_header_size = INSTRUMENT_HEADER_LENGTH;

#if XM_STRINGS
		READ_MEMCPY_BOUND(instr->name, offset + 4, INSTRUMENT_NAME_LENGTH, offset + ins_header_size);
		instr->name[INSTRUMENT_NAME_LENGTH] = 0;
#endif
	    instr->num_samples = READ_U16_BOUND(offset + 27, offset + ins_header_size);

		if(instr->num_samples > 0) {
			/* Read extra header properties */
			READ_MEMCPY_BOUND(instr->sample_of_notes, offset + 33, NUM_NOTES, offset + ins_header_size);

			instr->volume_envelope.num_points = READ_U8_BOUND(offset + 225, offset + ins_header_size);
			if (instr->volume_envelope.num_points > NUM_ENVELOPE_POINTS)
				instr->volume_envelope.num_points = NUM_ENVELOPE_POINTS;

			instr->panning_envelope.num_points = READ_U8_BOUND(offset + 226, offset + ins_header_size);
			if (instr->panning_envelope.num_points > NUM_ENVELOPE_POINTS)
				instr->panning_envelope.num_points = NUM_ENVELOPE_POINTS;

			for(uint8_t j = 0; j < instr->volume_envelope.num_points; ++j) {
				instr->volume_envelope.points[j].frame = READ_U16_BOUND(offset + 129 + 4 * j, offset + ins_header_size);
				instr->volume_envelope.points[j].value = READ_U16_BOUND(offset + 129 + 4 * j + 2, offset + ins_header_size);
			}

			for(uint8_t j = 0; j < instr->panning_envelope.num_points; ++j) {
				instr->panning_envelope.points[j].frame = READ_U16_BOUND(offset + 177 + 4 * j, offset + ins_header_size);
				instr->panning_envelope.points[j].value = READ_U16_BOUND(offset + 177 + 4 * j + 2, offset + ins_header_size);
			}

			instr->volume_envelope.sustain_point = READ_U8_BOUND(offset + 227, offset + ins_header_size);
			instr->volume_envelope.loop_start_point = READ_U8_BOUND(offset + 228, offset + ins_header_size);
			instr->volume_envelope.loop_end_point = READ_U8_BOUND(offset + 229, offset + ins_header_size);

			instr->panning_envelope.sustain_point = READ_U8_BOUND(offset + 230, offset + ins_header_size);
			instr->panning_envelope.loop_start_point = READ_U8_BOUND(offset + 231, offset + ins_header_size);
			instr->panning_envelope.loop_end_point = READ_U8_BOUND(offset + 232, offset + ins_header_size);

			// Fix broken modules with loop points outside of defined points
			if (instr->volume_envelope.num_points > 0) {
				instr->volume_envelope.loop_start_point =
					MIN(instr->volume_envelope.loop_start_point, instr->volume_envelope.num_points-1);
				instr->volume_envelope.loop_end_point =
					MIN(instr->volume_envelope.loop_end_point,   instr->volume_envelope.num_points-1);
			}
			if (instr->panning_envelope.num_points > 0) {
				instr->panning_envelope.loop_start_point =
					MIN(instr->panning_envelope.loop_start_point, instr->panning_envelope.num_points-1);
				instr->panning_envelope.loop_end_point =
					MIN(instr->panning_envelope.loop_end_point,   instr->panning_envelope.num_points-1);
			}

			uint8_t flags = READ_U8_BOUND(offset + 233, offset + ins_header_size);
			instr->volume_envelope.enabled = flags & (1 << 0);
			instr->volume_envelope.sustain_enabled = flags & (1 << 1);
			instr->volume_envelope.loop_enabled = flags & (1 << 2);

			flags = READ_U8_BOUND(offset + 234, offset + ins_header_size);
			instr->panning_envelope.enabled = flags & (1 << 0);
			instr->panning_envelope.sustain_enabled = flags & (1 << 1);
			instr->panning_envelope.loop_enabled = flags & (1 << 2);

			instr->vibrato_type = READ_U8_BOUND(offset + 235, offset + ins_header_size);
			if(instr->vibrato_type == 2) {
				instr->vibrato_type = 1;
			} else if(instr->vibrato_type == 1) {
				instr->vibrato_type = 2;
			}
			instr->vibrato_sweep = READ_U8_BOUND(offset + 236, offset + ins_header_size);
			instr->vibrato_depth = READ_U8_BOUND(offset + 237, offset + ins_header_size);
			instr->vibrato_rate = READ_U8_BOUND(offset + 238, offset + ins_header_size);
			instr->volume_fadeout = READ_U16_BOUND(offset + 239, offset + ins_header_size);

			instr->samples = (xm_sample_t*)mempool;
			mempool += instr->num_samples * sizeof(xm_sample_t);
		} else {
			instr->samples = NULL;
		}

		/* Instrument header size */
		offset += ins_header_size;

		for(uint16_t j = 0; j < instr->num_samples; ++j) {
			/* Read sample header */
			xm_sample_t* sample = instr->samples + j;

			sample->length = READ_U32(offset);
			sample->loop_start = READ_U32(offset + 4);
			sample->loop_length = READ_U32(offset + 8);
			sample->loop_end = sample->loop_start + sample->loop_length;
			sample->volume = (float)READ_U8(offset + 12) / (float)0x40;
			sample->finetune = (int8_t)READ_U8(offset + 13);

			/* Fix invalid loop definitions */
			if (sample->loop_start > sample->length)
				sample->loop_start = sample->length;
			if (sample->loop_end > sample->length)
				sample->loop_end = sample->length;
			sample->loop_length = sample->loop_end - sample->loop_start;

			uint8_t flags = READ_U8(offset + 14);
			if((flags & 3) == 0 || sample->loop_length == 0) {
				sample->loop_type = XM_NO_LOOP;
			} else if((flags & 3) == 1) {
				sample->loop_type = XM_FORWARD_LOOP;
			} else {
				sample->loop_type = XM_PING_PONG_LOOP;
			}

			sample->bits = (flags & (1 << 4)) ? 16 : 8;

			sample->panning = (float)READ_U8(offset + 15) / (float)0xFF;
			sample->relative_note = (int8_t)READ_U8(offset + 16);
#if XM_STRINGS
			READ_MEMCPY(sample->name, offset + 18, SAMPLE_NAME_LENGTH);
			sample->name[SAMPLE_NAME_LENGTH] = 0;
#endif
			sample->data8 = (int8_t*)mempool;
			mempool += sample->length;

			if(sample->bits == 16) {
				sample->loop_start >>= 1;
				sample->loop_length >>= 1;
				sample->loop_end >>= 1;
				sample->length >>= 1;
			}

			/* Notice that, even if there's a "sample header size" in the
			   instrument header, that value seems ignored, and might even
			   be wrong in some corrupted modules. */
			offset += 40;
		}

		for(uint16_t j = 0; j < instr->num_samples; ++j) {
			/* Read sample data */
			xm_sample_t* sample = instr->samples + j;
			uint32_t length = sample->length;

			if(sample->bits == 16) {
				int16_t v = 0;
				for(uint32_t k = 0; k < length; ++k) {
					v = v + (int16_t)READ_U16(offset + (k << 1));
					sample->data16[k] = v;
				}
				offset += sample->length << 1;
			} else {
				int8_t v = 0;
				for(uint32_t k = 0; k < length; ++k) {
					v = v + (int8_t)READ_U8(offset + k);
					sample->data8[k] = v;
				}
				offset += sample->length;
			}
		}
	}

	return mempool;
}